

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O2

int lws_hdr_custom_copy(lws *wsi,char *dst,int len,char *name,int nlen)

{
  allocated_headers *paVar1;
  char *pcVar2;
  uint16_t uVar3;
  int iVar4;
  ah_data_idx_t aVar5;
  
  if (((wsi->http).ah != (allocated_headers *)0x0) && ((wsi->field_0x46e & 2) == 0)) {
    *dst = '\0';
    for (aVar5 = ((wsi->http).ah)->unk_ll_head;
        (aVar5 != 0 && (paVar1 = (wsi->http).ah, aVar5 < paVar1->data_length));
        aVar5 = lws_ser_ru32be((uint8_t *)(pcVar2 + (aVar5 + 4)))) {
      uVar3 = lws_ser_ru16be((uint8_t *)(paVar1->data + aVar5));
      pcVar2 = ((wsi->http).ah)->data;
      if ((uint)uVar3 == nlen) {
        iVar4 = strncmp(name,pcVar2 + (aVar5 + 8),(ulong)(uint)nlen);
        if (iVar4 == 0) {
          uVar3 = lws_ser_ru16be((uint8_t *)(pcVar2 + (aVar5 + 2)));
          if ((int)(uint)uVar3 < len) {
            strncpy(dst,((wsi->http).ah)->data + (aVar5 + 8 + nlen),(ulong)uVar3);
            dst[uVar3] = '\0';
            return (uint)uVar3;
          }
          return -1;
        }
      }
    }
  }
  return -1;
}

Assistant:

int
lws_hdr_custom_copy(struct lws *wsi, char *dst, int len, const char *name,
		    int nlen)
{
	ah_data_idx_t ll;
	int n;

	if (!wsi->http.ah || wsi->mux_substream)
		return -1;

	*dst = '\0';

	ll = wsi->http.ah->unk_ll_head;
	while (ll) {
		if (ll >= wsi->http.ah->data_length)
			return -1;
		if (nlen == lws_ser_ru16be(
			(uint8_t *)&wsi->http.ah->data[ll + UHO_NLEN]) &&
		    !strncmp(name, &wsi->http.ah->data[ll + UHO_NAME], (unsigned int)nlen)) {
			n = lws_ser_ru16be(
				(uint8_t *)&wsi->http.ah->data[ll + UHO_VLEN]);
			if (n + 1 > len)
				return -1;
			strncpy(dst, &wsi->http.ah->data[ll + UHO_NAME + (unsigned int)nlen], (unsigned int)n);
			dst[n] = '\0';

			return n;
		}
		ll = lws_ser_ru32be((uint8_t *)&wsi->http.ah->data[ll + UHO_LL]);
	}

	return -1;
}